

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsscreen.cpp
# Opt level: O0

Format __thiscall QEglFSKmsScreen::format(QEglFSKmsScreen *this)

{
  uint32_t uVar1;
  QEglFSKmsScreen *this_local;
  Format local_4;
  
  uVar1 = (this->m_output).drm_format;
  if (uVar1 == 0x30334241) {
    local_4 = Format_A2BGR30_Premultiplied;
  }
  else if (uVar1 == 0x30334258) {
    local_4 = Format_BGR30;
  }
  else if (uVar1 == 0x30335241) {
    local_4 = Format_A2RGB30_Premultiplied;
  }
  else if (uVar1 == 0x30335258) {
    local_4 = Format_RGB30;
  }
  else if ((uVar1 == 0x34324241) || (uVar1 == 0x34325241)) {
    local_4 = Format_ARGB32;
  }
  else if ((uVar1 == 0x36314742) || (uVar1 == 0x36314752)) {
    local_4 = Format_RGB16;
  }
  else {
    local_4 = Format_RGB32;
  }
  return local_4;
}

Assistant:

QImage::Format QEglFSKmsScreen::format() const
{
    // the result can be slightly incorrect, it won't matter in practice
    switch (m_output.drm_format) {
    case DRM_FORMAT_ARGB8888:
    case DRM_FORMAT_ABGR8888:
        return QImage::Format_ARGB32;
    case DRM_FORMAT_RGB565:
    case DRM_FORMAT_BGR565:
        return QImage::Format_RGB16;
    case DRM_FORMAT_XRGB2101010:
        return QImage::Format_RGB30;
    case DRM_FORMAT_XBGR2101010:
        return QImage::Format_BGR30;
    case DRM_FORMAT_ARGB2101010:
        return QImage::Format_A2RGB30_Premultiplied;
    case DRM_FORMAT_ABGR2101010:
        return QImage::Format_A2BGR30_Premultiplied;
    default:
        return QImage::Format_RGB32;
    }
}